

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int param_1,char **argv)

{
  istream *this;
  long lVar1;
  long lVar2;
  ostream *poVar3;
  int nt;
  int nx;
  string timing_file_name;
  string output_file_name;
  string input_file_name;
  fstream input_file;
  fstream timing_file;
  fstream output_file;
  int local_6b8;
  int local_6b4;
  double local_6b0;
  long *local_6a8 [2];
  long local_698 [2];
  long *local_688 [2];
  long local_678 [2];
  long *local_668 [2];
  long local_658 [2];
  allocator<char> local_648 [528];
  undefined1 local_438 [528];
  undefined1 local_228 [528];
  
  std::ios_base::sync_with_stdio(false);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_668,argv[1],local_648);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_688,argv[2],local_648);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_6a8,argv[3],local_648);
  std::fstream::fstream(local_648,(string *)local_668,_S_in);
  this = (istream *)std::istream::operator>>((istream *)local_648,&local_6b4);
  std::istream::operator>>(this,&local_6b8);
  lVar1 = std::chrono::_V2::system_clock::now();
  local_6b0 = solve_problem(local_6b4,local_6b8);
  lVar2 = std::chrono::_V2::system_clock::now();
  std::fstream::fstream(local_228,(string *)local_688,_S_out);
  poVar3 = std::ostream::_M_insert<double>(local_6b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::fstream::fstream(local_438,(string *)local_6a8,_S_out);
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::fstream::~fstream(local_438);
  std::fstream::~fstream(local_228);
  std::fstream::~fstream(local_648);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0],local_698[0] + 1);
  }
  if (local_688[0] != local_678) {
    operator_delete(local_688[0],local_678[0] + 1);
  }
  if (local_668[0] != local_658) {
    operator_delete(local_668[0],local_658[0] + 1);
  }
  return 0;
}

Assistant:

int main(int, char** argv)
{
    std::ios_base::sync_with_stdio(false);

    std::string input_file_name(argv[1]);
    std::string output_file_name(argv[2]);
    std::string timing_file_name(argv[3]);

    std::fstream input_file(input_file_name, std::ios::in);
    int nx, nt;
    input_file >> nx >> nt;

    auto start_time = std::chrono::high_resolution_clock::now();
    double error = solve_problem(nx, nt);
    auto end_time = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double> elapsed_time = end_time - start_time;

    std::fstream output_file(output_file_name, std::ios::out);
    output_file << error << std::endl;

    std::fstream timing_file(timing_file_name, std::ios::out);
    timing_file << elapsed_time.count() << std::endl;

    return 0;
}